

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O0

int szipLoadEntry(SZIPinfo *info,PHYSFS_uint32 idx)

{
  undefined1 *puVar1;
  uint isdir_00;
  char *len;
  size_t sVar2;
  SZIPinfo *dt;
  PHYSFS_uint16 *len_00;
  char *pcVar3;
  undefined1 *puVar4;
  ulong fileIndex;
  CSzArEx *p;
  undefined1 auStack_68 [8];
  undefined1 *local_60;
  undefined1 *local_58;
  void *local_50;
  SZIPentry *entry;
  int isdir;
  int retval;
  char *utf8;
  size_t utf8buflen;
  PHYSFS_uint16 *utf16;
  size_t utf16buflen;
  size_t utf16len;
  SZIPinfo *pSStack_10;
  PHYSFS_uint32 idx_local;
  SZIPinfo *info_local;
  
  puVar4 = auStack_68;
  utf16len._4_4_ = idx;
  pSStack_10 = info;
  utf16buflen = SzArEx_GetFileNameUtf16(&info->db,(ulong)idx,(UInt16 *)0x0);
  len_00 = (PHYSFS_uint16 *)(utf16buflen * 2);
  if (len_00 < (PHYSFS_uint16 *)0x100) {
    puVar4 = auStack_68 + -((long)len_00 + 0x17U & 0xfffffffffffffff0);
    local_58 = puVar4;
  }
  else {
    local_58 = (undefined1 *)0x0;
  }
  puVar1 = local_58;
  utf16 = len_00;
  *(undefined8 *)(puVar4 + -8) = 0x11ff2e;
  utf8buflen = (size_t)__PHYSFS_initSmallAlloc(puVar1,(size_t)len_00);
  pcVar3 = (char *)(utf16buflen * 4);
  if (pcVar3 < (char *)0x100) {
    puVar4 = puVar4 + -((ulong)(pcVar3 + 0x17) & 0xfffffffffffffff0);
    local_60 = puVar4;
  }
  else {
    local_60 = (undefined1 *)0x0;
  }
  puVar1 = local_60;
  utf8 = pcVar3;
  *(undefined8 *)(puVar4 + -8) = 0x11ff78;
  _isdir = (char *)__PHYSFS_initSmallAlloc(puVar1,(size_t)pcVar3);
  sVar2 = utf8buflen;
  entry._4_4_ = 0;
  if ((utf8buflen != 0) && (_isdir != (char *)0x0)) {
    entry._0_4_ = (uint)(((uint)(pSStack_10->db).IsDirs[utf16len._4_4_ >> 3] &
                         0x80 >> ((byte)utf16len._4_4_ & 7)) != 0);
    p = &pSStack_10->db;
    fileIndex = (ulong)utf16len._4_4_;
    *(undefined8 *)(puVar4 + -8) = 0x11fff0;
    SzArEx_GetFileNameUtf16(p,fileIndex,(UInt16 *)sVar2);
    sVar2 = utf8buflen;
    len = utf8;
    pcVar3 = _isdir;
    *(undefined8 *)(puVar4 + -8) = 0x120001;
    PHYSFS_utf8FromUtf16((PHYSFS_uint16 *)sVar2,pcVar3,(PHYSFS_uint64)len);
    dt = pSStack_10;
    pcVar3 = _isdir;
    isdir_00 = (uint)entry;
    *(undefined8 *)(puVar4 + -8) = 0x120011;
    local_50 = __PHYSFS_DirTreeAdd(&dt->tree,pcVar3,isdir_00);
    entry._4_4_ = (uint)(local_50 != (void *)0x0);
    if (entry._4_4_ != 0) {
      *(PHYSFS_uint32 *)((long)local_50 + 0x28) = utf16len._4_4_;
    }
  }
  pcVar3 = _isdir;
  *(undefined8 *)(puVar4 + -8) = 0x120040;
  __PHYSFS_smallFree(pcVar3);
  sVar2 = utf8buflen;
  *(undefined8 *)(puVar4 + -8) = 0x120049;
  __PHYSFS_smallFree((void *)sVar2);
  return entry._4_4_;
}

Assistant:

static int szipLoadEntry(SZIPinfo *info, const PHYSFS_uint32 idx)
{
    const size_t utf16len = SzArEx_GetFileNameUtf16(&info->db, idx, NULL);
    const size_t utf16buflen = utf16len * 2;
    PHYSFS_uint16 *utf16 = (PHYSFS_uint16 *) __PHYSFS_smallAlloc(utf16buflen);
    const size_t utf8buflen = utf16len * 4;
    char *utf8 = (char *) __PHYSFS_smallAlloc(utf8buflen);
    int retval = 0;

    if (utf16 && utf8)
    {
        const int isdir = SzArEx_IsDir(&info->db, idx) != 0;
        SZIPentry *entry;
        SzArEx_GetFileNameUtf16(&info->db, idx, (UInt16 *) utf16);
        PHYSFS_utf8FromUtf16(utf16, utf8, utf8buflen);
        entry = (SZIPentry*) __PHYSFS_DirTreeAdd(&info->tree, utf8, isdir);
        retval = (entry != NULL);
        if (retval)
            entry->dbidx = idx;
    } /* if */

    __PHYSFS_smallFree(utf8);
    __PHYSFS_smallFree(utf16);

    return retval;
}